

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCheckTweakAddFromSchnorrPubkey
              (void *handle,char *tweaked_pubkey,bool tweaked_parity,char *base_pubkey,char *tweak)

{
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  allocator local_91;
  undefined1 local_90 [32];
  ByteData256 tweak_obj;
  SchnorrPubkey base_pubkey_obj;
  SchnorrPubkey pubkey_obj;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tweaked_pubkey);
  if (bVar1) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x23f;
    local_90._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"tweak pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. tweak pubkey is null or empty.",
               (allocator *)&tweak_obj);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(base_pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(tweak);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_90,tweak,(allocator *)&pubkey_obj);
      cfd::core::ByteData256::ByteData256(&tweak_obj,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::string((string *)local_90,tweaked_pubkey,(allocator *)&base_pubkey_obj);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&pubkey_obj,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::string((string *)local_90,base_pubkey,&local_91);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&base_pubkey_obj,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      bVar1 = cfd::core::SchnorrPubkey::IsTweaked
                        (&pubkey_obj,&base_pubkey_obj,&tweak_obj,tweaked_parity);
      iVar3 = 7;
      if (bVar1) {
        iVar3 = 0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&base_pubkey_obj);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_obj);
      return iVar3;
    }
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x24b;
    local_90._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"tweak is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. tweak is null or empty.",
               (allocator *)&tweak_obj);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90._0_8_ = "cfdcapi_key.cpp";
  local_90._8_4_ = 0x245;
  local_90._16_8_ = "CfdCheckTweakAddFromSchnorrPubkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"pubkey is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_90,"Failed to parameter. pubkey is null or empty.",
             (allocator *)&tweak_obj);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCheckTweakAddFromSchnorrPubkey(
    void* handle, const char* tweaked_pubkey, bool tweaked_parity,
    const char* base_pubkey, const char* tweak) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tweaked_pubkey)) {
      warn(CFD_LOG_SOURCE, "tweak pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak pubkey is null or empty.");
    }
    if (IsEmptyString(base_pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    SchnorrPubkey pubkey_obj = SchnorrPubkey(std::string(tweaked_pubkey));
    SchnorrPubkey base_pubkey_obj = SchnorrPubkey(std::string(base_pubkey));
    bool is_tweaked =
        pubkey_obj.IsTweaked(base_pubkey_obj, tweak_obj, tweaked_parity);
    if (!is_tweaked) {
      return CfdErrorCode::kCfdSignVerificationError;
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}